

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderGLImpl.cpp
# Opt level: O1

void __thiscall
Diligent::ShaderGLImpl::ShaderBuilder::HandleCompilingState
          (ShaderBuilder *this,bool WaitForCompletion)

{
  bool bVar1;
  char (*in_RCX) [28];
  GLint CompilationComplete;
  string msg;
  GLint local_3c;
  string local_38;
  
  if (this->m_State != Compiling) {
    FormatString<char[26],char[28]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_State == State::Compiling",in_RCX);
    in_RCX = (char (*) [28])0x66;
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"HandleCompilingState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderGLImpl.cpp"
               ,0x66);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  local_3c = 0;
  if (WaitForCompletion) {
    local_3c = 1;
  }
  else {
    if (this->m_CreateAsynchronously == false) {
      FormatString<char[26],char[23]>
                (&local_38,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_CreateAsynchronously",(char (*) [23])in_RCX);
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"HandleCompilingState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderGLImpl.cpp"
                 ,0x6b);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
    (*__glewGetShaderiv)((this->m_Shader->m_GLShaderObj).m_uiHandle,0x91b1,&local_3c);
  }
  if (local_3c != 0) {
    bVar1 = GetCompileStatus(this->m_Shader,this->m_ppCompilerOutput,
                             (bool)(this->m_CreateAsynchronously ^ 1));
    this->m_State = (uint)!bVar1 * 2 + Linking;
  }
  return;
}

Assistant:

void HandleCompilingState(bool WaitForCompletion)
    {
        VERIFY_EXPR(m_State == State::Compiling);

        GLint CompilationComplete = GL_FALSE;
        if (!WaitForCompletion)
        {
            VERIFY_EXPR(m_CreateAsynchronously);
            glGetShaderiv(m_Shader.m_GLShaderObj, GL_COMPLETION_STATUS_KHR, &CompilationComplete);
        }
        else
        {
            CompilationComplete = GL_TRUE;
        }

        if (CompilationComplete)
        {
            m_State = m_Shader.GetCompileStatus(m_ppCompilerOutput, /*ThrowOnError = */ !m_CreateAsynchronously) ? State::Linking : State::Failed;
        }
    }